

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsComponentAddRelation(FmsComponent comp,FmsInt other_comp_id)

{
  ulong uVar1;
  FmsInt FVar2;
  undefined8 in_RSI;
  long in_RDI;
  FmsInt nc;
  FmsInt *relations;
  FmsInt num_relations;
  void *local_28;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x28);
    local_28 = *(void **)(in_RDI + 0x40);
    FVar2 = NextPow2(uVar1 + 1);
    if (uVar1 <= FVar2 >> 1) {
      local_28 = realloc(local_28,FVar2 << 3);
      if (local_28 == (void *)0x0) {
        return 2;
      }
      *(void **)(in_RDI + 0x40) = local_28;
    }
    *(undefined8 *)((long)local_28 + uVar1 * 8) = in_RSI;
    *(ulong *)(in_RDI + 0x28) = uVar1 + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsComponentAddRelation(FmsComponent comp, FmsInt other_comp_id) {
  if (!comp) { E_RETURN(1); }
  FmsInt num_relations = comp->num_relations;
  FmsInt *relations = comp->relations;
  FmsInt nc = NextPow2(num_relations + 1);
  if (num_relations <= nc/2) {
    relations = realloc(relations, nc*sizeof(FmsInt));
    if (relations == NULL) { E_RETURN(2); }
    comp->relations = relations;
  }
  relations[num_relations] = other_comp_id;
  comp->num_relations = num_relations + 1;
  return 0;
}